

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O3

void __thiscall
TPZTransfer<std::complex<double>_>::SetBlockMatrix
          (TPZTransfer<std::complex<double>_> *this,int row,int col,
          TPZFMatrix<std::complex<double>_> *mat)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  long *plVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  TPZFMatrix<std::complex<double>_> bl;
  complex<double> *local_d0;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  iVar6 = (this->fColPosition).fStore[row];
  uVar10 = (ulong)iVar6;
  iVar1 = (this->fNumberofColumnBlocks).fStore[row];
  if (iVar1 == -1 || uVar10 == 0xffffffffffffffff) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : ",0x41);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," row = ",7);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,row);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," col = ",7);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,col);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," colpos = ",10);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," numcolblocks = ",0x10);
    plVar4 = (long *)std::ostream::operator<<(poVar3,iVar1);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0xa4);
  }
  uVar2 = iVar6 + iVar1;
  uVar11 = uVar10;
  if (0 < iVar1) {
    uVar7 = (ulong)(iVar6 + 1U);
    if ((int)(iVar6 + 1U) < (int)uVar2) {
      uVar7 = (ulong)uVar2;
    }
    do {
      uVar11 = uVar10;
      if ((this->fColumnBlockNumber).super_TPZVec<int>.fStore[uVar10] == col) break;
      uVar10 = uVar10 + 1;
      uVar11 = uVar7;
    } while ((long)uVar10 < (long)(int)uVar2);
  }
  if ((uint)uVar11 == uVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZTransfer<TVar>::SetBlockMatrix column not found for row = "
               ,0x3d);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,row);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," col = ",7);
    plVar4 = (long *)std::ostream::operator<<(poVar3,col);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0xad);
  }
  iVar6 = (this->fRowBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[row].dim;
  lVar5 = (long)iVar6;
  iVar1 = (this->fColBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[col].dim;
  lVar8 = (long)iVar1;
  if (((mat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow != lVar5) ||
     ((mat->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol != lVar8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions :  nblrows = ",
               0x52);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," nblcols = ",0xb);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," mat.rows = ",0xc);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," mat.cols ",10);
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Solvers/Multigrid/pztransfer.cpp"
               ,0xb5);
  }
  iVar6 = iVar6 * iVar1;
  ExpandDoubleValueEntries(this,iVar6);
  local_c0.fElem =
       (this->fDoubleValues).super_TPZVec<std::complex<double>_>.fStore + this->fDoubleValLastUsed;
  lVar9 = (long)iVar6;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01819c58;
  local_d0 = (complex<double> *)0x0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar5;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar8;
  local_c0.fGiven = local_c0.fElem;
  local_c0.fSize = lVar9;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  local_c0.fWork.fStore = (complex<double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar10 = lVar8 * lVar5;
  if (uVar10 != 0) {
    if (uVar10 - lVar9 == 0 || (long)uVar10 < lVar9) goto LAB_00ba280b;
    local_d0 = (complex<double> *)operator_new__(-(ulong)(uVar10 >> 0x3c != 0) | uVar10 * 0x10);
    memset(local_d0,0,uVar10 * 0x10);
  }
  local_c0.fElem = local_d0;
LAB_00ba280b:
  TPZFMatrix<std::complex<double>_>::operator=(&local_c0,mat);
  iVar1 = this->fDoubleValLastUsed;
  (this->fColumnBlockPosition).super_TPZVec<int>.fStore[(int)(uint)uVar11] = iVar1;
  this->fDoubleValLastUsed = iVar6 + iVar1;
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZTransfer<TVar>::SetBlockMatrix(int row, int col, TPZFMatrix<TVar> &mat){
	// sets the row,col block equal to matrix mat
	// if row col was not specified by AddBlockNumbers, an error
	//		will be issued and exit
	// find row,col
	int colpos = fColPosition[row];
	int numcolblocks = fNumberofColumnBlocks[row];
	if(colpos == -1 || numcolblocks == -1) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix called for ilegal parameters : "
		<< " row = " << row << " col = " << col << " colpos = " << colpos <<
		" numcolblocks = " << numcolblocks << endl;
		DebugStop();
	}
	int ic = colpos, lastic = colpos+numcolblocks;
	for(;ic<lastic;ic++) {
		if(fColumnBlockNumber[ic] == col) break;
	}
	if(ic == lastic) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix column not found for row = " << row <<
		" col = " << col << endl;
		DebugStop();
	}
	int nblrows = fRowBlock.Size(row);
	int nblcols = fColBlock.Size(col);
	if(nblrows != mat.Rows() || nblcols != mat.Cols()) {
		cout << "TPZTransfer<TVar>::SetBlockMatrix matrix has incompatible dimensions : "
		" nblrows = " << nblrows << " nblcols = " << nblcols << " mat.rows = " <<
		mat.Rows() << " mat.cols " << mat.Cols() << endl;
		DebugStop();
	}
	ExpandDoubleValueEntries(nblrows*nblcols);
	TPZFMatrix<TVar> bl(nblrows,nblcols,&fDoubleValues[fDoubleValLastUsed],nblrows*nblcols);
	bl = mat;
	fColumnBlockPosition[ic] = fDoubleValLastUsed;
	fDoubleValLastUsed += nblrows*nblcols;
}